

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int valueFromValueList(sqlite3_value *pVal,sqlite3_value **ppOut,int bNext)

{
  char *pcVar1;
  BtCursor *pCur;
  Mem *pMem;
  long lVar2;
  u8 uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  u32 iSerial;
  int dummy;
  u32 local_6c;
  MemValue local_68;
  long lStack_60;
  ulong uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *ppOut = (sqlite3_value *)0x0;
  if (pVal == (sqlite3_value *)0x0) {
    iVar4 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x16622,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    goto LAB_00125d0e;
  }
  iVar4 = 1;
  if (((pVal->flags & 0x1000) == 0) || (pVal->xDel != sqlite3VdbeValueListFree)) goto LAB_00125d0e;
  pcVar1 = pVal->z;
  if (bNext == 0) {
    local_68.i = local_68.i & 0xffffffff00000000;
    iVar5 = sqlite3BtreeFirst(*(BtCursor **)pcVar1,&local_68.nZero);
    iVar4 = 0x65;
    if (**(char **)pcVar1 == '\0') {
      iVar4 = iVar5;
    }
  }
  else {
    iVar4 = sqlite3BtreeNext(*(BtCursor **)pcVar1,(int)ppOut);
  }
  if (iVar4 != 0) goto LAB_00125d0e;
  uStack_48 = 0;
  local_40 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_68.r = 0.0;
  lStack_60 = 0;
  uStack_38 = 0;
  pCur = *(BtCursor **)pcVar1;
  getCellInfo(pCur);
  iVar4 = sqlite3VdbeMemFromBtreeZeroOffset
                    (*(BtCursor **)pcVar1,(pCur->info).nPayload,(Mem *)&local_68);
  lVar2 = lStack_60;
  if (iVar4 == 0) {
    local_6c = 0xaaaaaaaa;
    pMem = *(Mem **)(pcVar1 + 8);
    if (*(char *)(lStack_60 + 1) < '\0') {
      uVar3 = sqlite3GetVarint32((uchar *)(lStack_60 + 1),&local_6c);
      uVar6 = (ulong)(byte)(uVar3 + 1);
    }
    else {
      uVar6 = 2;
      local_6c = (int)*(char *)(lStack_60 + 1);
    }
    sqlite3VdbeSerialGet((uchar *)(lVar2 + uVar6),local_6c,pMem);
    pMem->enc = pMem->db->enc;
    if ((pMem->flags & 0x4000) != 0) {
      iVar5 = sqlite3VdbeMemMakeWriteable(pMem);
      iVar4 = 7;
      if (iVar5 != 0) goto LAB_00125e28;
    }
    *ppOut = pMem;
    iVar4 = 0;
  }
LAB_00125e28:
  if (((uStack_58 & 0x900000000000) != 0) || ((int)uStack_48 != 0)) {
    vdbeMemClear((Mem *)&local_68);
  }
LAB_00125d0e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int valueFromValueList(
  sqlite3_value *pVal,        /* Pointer to the ValueList object */
  sqlite3_value **ppOut,      /* Store the next value from the list here */
  int bNext                   /* 1 for _next(). 0 for _first() */
){
  int rc;
  ValueList *pRhs;

  *ppOut = 0;
  if( pVal==0 ) return SQLITE_MISUSE_BKPT;
  if( (pVal->flags & MEM_Dyn)==0 || pVal->xDel!=sqlite3VdbeValueListFree ){
    return SQLITE_ERROR;
  }else{
    assert( (pVal->flags&(MEM_TypeMask|MEM_Term|MEM_Subtype)) ==
                 (MEM_Null|MEM_Term|MEM_Subtype) );
    assert( pVal->eSubtype=='p' );
    assert( pVal->u.zPType!=0 && strcmp(pVal->u.zPType,"ValueList")==0 );
    pRhs = (ValueList*)pVal->z;
  }
  if( bNext ){
    rc = sqlite3BtreeNext(pRhs->pCsr, 0);
  }else{
    int dummy = 0;
    rc = sqlite3BtreeFirst(pRhs->pCsr, &dummy);
    assert( rc==SQLITE_OK || sqlite3BtreeEof(pRhs->pCsr) );
    if( sqlite3BtreeEof(pRhs->pCsr) ) rc = SQLITE_DONE;
  }
  if( rc==SQLITE_OK ){
    u32 sz;       /* Size of current row in bytes */
    Mem sMem;     /* Raw content of current row */
    memset(&sMem, 0, sizeof(sMem));
    sz = sqlite3BtreePayloadSize(pRhs->pCsr);
    rc = sqlite3VdbeMemFromBtreeZeroOffset(pRhs->pCsr,(int)sz,&sMem);
    if( rc==SQLITE_OK ){
      u8 *zBuf = (u8*)sMem.z;
      u32 iSerial;
      sqlite3_value *pOut = pRhs->pOut;
      int iOff = 1 + getVarint32(&zBuf[1], iSerial);
      sqlite3VdbeSerialGet(&zBuf[iOff], iSerial, pOut);
      pOut->enc = ENC(pOut->db);
      if( (pOut->flags & MEM_Ephem)!=0 && sqlite3VdbeMemMakeWriteable(pOut) ){
        rc = SQLITE_NOMEM;
      }else{
        *ppOut = pOut;
      }
    }
    sqlite3VdbeMemRelease(&sMem);
  }
  return rc;
}